

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O1

void compute_ui_entry_values_for_player
               (ui_entry *entry,player *p,cached_player_data **cache,int *val,int *auxval)

{
  char cVar1;
  ushort uVar2;
  short sVar3;
  char *__s1;
  loc grid;
  bound_object_property *pbVar4;
  short *psVar5;
  int iVar6;
  bool bVar7;
  ui_entry_combiner_funcs *puVar8;
  _Bool _Var9;
  _Bool _Var10;
  int iVar11;
  wchar_t wVar12;
  int iVar13;
  cached_player_data *f;
  object *poVar14;
  bound_player_ability *pbVar15;
  int *piVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  _Bool _Var22;
  wchar_t wVar23;
  uint uVar24;
  wchar_t wVar25;
  long lVar26;
  bool bVar27;
  ui_entry_combiner_state_conflict cst;
  ui_entry_combiner_funcs_conflict combiner;
  ui_entry_combiner_state local_98;
  ui_entry_combiner_funcs local_80;
  bitflag *local_60;
  int *local_58;
  int *local_50;
  ulong local_48;
  cached_player_data **local_40;
  int *local_38;
  
  local_98.work = (void *)0x0;
  local_98.accum = 0;
  local_98.accum_aux = 0;
  if (p == (player *)0x0) {
    *val = 0x7ffffffe;
    local_98.accum_aux = 0x7ffffffe;
  }
  else {
    local_58 = val;
    local_50 = auxval;
    if (*cache == (cached_player_data *)0x0) {
      f = (cached_player_data *)mem_alloc(0xc);
      *cache = f;
      player_flags(p,(bitflag *)f);
      flag_wipe((*cache)->timed,6);
      player_flags_timed(p,(*cache)->timed);
      if (p->timed[0x20] != 0) {
        flag_on_dbg((*cache)->timed,6,0x28,"(*cache)->timed","OF_TRAP_IMMUNE");
      }
    }
    local_40 = cache;
    iVar11 = ui_entry_combiner_get_funcs(entry->combiner_index,&local_80);
    if (iVar11 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry.c"
                    ,0x375,
                    "void compute_ui_entry_values_for_player(const struct ui_entry *, struct player *, struct cached_player_data **, int *, int *)"
                   );
    }
    if (entry->n_p_ability < L'\x01') {
      bVar7 = true;
    }
    else {
      local_60 = (p->state).pflags;
      bVar7 = true;
      local_38 = &timed_effects[0].temp_resist;
      lVar18 = 0;
      local_48 = 0;
      do {
        pbVar15 = entry->p_abilities;
        uVar2 = (pbVar15[lVar18].ability)->index;
        wVar12 = entry->flags;
        if (((wVar12 & 1U) == 0) || (pbVar15[lVar18].isaux == false)) {
          __s1 = (pbVar15[lVar18].ability)->type;
          iVar11 = strcmp(__s1,"player");
          uVar21 = (uint)uVar2;
          if (iVar11 == 0) {
            _Var10 = flag_has_dbg(local_60,10,(uint)uVar2,"p->state.pflags","(ind)");
            if (_Var10) {
              pbVar15 = entry->p_abilities;
              if (pbVar15[lVar18].have_value == true) {
                bVar27 = pbVar15[lVar18].isaux != false;
                wVar12 = L'\x7ffffffe';
                if (bVar27) {
                  wVar12 = pbVar15[lVar18].value;
                }
                wVar25 = pbVar15[lVar18].value;
                if (bVar27) {
                  wVar25 = L'\x7ffffffe';
                }
              }
              else {
                if (uVar2 < 0x2e) {
                  if (uVar2 < 0x19) {
                    if (uVar2 == 0x12) {
                      _Var10 = player_of_has(p,L'\x1e');
                      if (_Var10) {
                        _Var10 = entry->p_abilities[lVar18].isaux;
                        wVar12 = (uint)(_Var10 ^ 1U) + (uint)(_Var10 ^ 1U) * 2 + L'\xfffffffd';
                        wVar25 = (uint)_Var10 + (uint)_Var10 * 2 + L'\xfffffffd';
                        goto joined_r0x001e342a;
                      }
                    }
                    else if (uVar2 == 0x13) {
                      wVar12 = slot_by_name(p,"weapon");
                      poVar14 = slot_object(p,wVar12);
                      wVar23 = L'\0';
                      if (poVar14 == (object *)0x0) {
                        wVar23 = (int)(short)(p->lev - (p->lev >> 0xf)) >> 1;
                      }
                      pbVar15 = entry->p_abilities;
                      goto LAB_001e35ab;
                    }
                  }
                  else {
                    if (uVar2 == 0x19) {
                      wVar23 = (wchar_t)(0x1d < p->lev);
                      cVar1 = pbVar15[lVar18].isaux;
                      goto LAB_001e35c4;
                    }
                    if (uVar2 == 0x25) {
                      poVar14 = equipped_item_by_slot_name(p,"shooting");
                      wVar25 = L'\0';
                      if ((poVar14 != (object *)0x0) &&
                         (_Var10 = flag_has_dbg(poVar14->kind->kind_flags,4,0x19,
                                                "launcher->kind->kind_flags","KF_SHOOTS_ARROWS"),
                         wVar25 = L'\0', _Var10)) {
                        wVar25 = (wchar_t)(p->lev / 3);
                      }
                      bVar27 = entry->p_abilities[lVar18].isaux != false;
                      wVar12 = L'\0';
                      if (bVar27) {
                        wVar12 = wVar25;
                      }
                      if (bVar27) {
                        wVar25 = L'\0';
                      }
                      goto joined_r0x001e342a;
                    }
                  }
                  goto LAB_001e3622;
                }
                if (uVar2 < 0x37) {
                  if (uVar21 == 0x2e) {
                    if (0x23 < p->lev) {
                      _Var10 = flag_has_dbg(local_60,10,0x2d,"p->state.pflags","(PF_STRONG_MAGIC)");
                      wVar23 = L'\x01';
                      if (_Var10) goto LAB_001e35a7;
                    }
                    wVar23 = (wchar_t)(0x2d < p->lev);
                  }
                  else {
                    if (uVar21 != 0x30) goto LAB_001e3622;
                    if ((character_dungeon == true) &&
                       (_Var10 = flag_has_dbg(local_60,10,0x16,"p->state.pflags","(PF_ELVEN)"),
                       _Var10)) {
                      grid.x = (p->grid).x;
                      grid.y = (p->grid).y;
                      _Var10 = square_istree(cave,grid);
                      wVar23 = L'\x03';
                      if (_Var10) goto LAB_001e35a7;
                    }
                    wVar23 = L'\0';
                  }
LAB_001e35a7:
                  pbVar15 = entry->p_abilities;
LAB_001e35ab:
                  cVar1 = pbVar15[lVar18].isaux;
LAB_001e35c4:
                  wVar25 = wVar23;
                  wVar12 = L'\0';
                  if (cVar1 != '\0') {
                    wVar25 = L'\0';
                    wVar12 = wVar23;
                  }
                }
                else {
                  if ((uVar2 != 0x37) && (uVar21 != 0x4a)) goto LAB_001e3622;
                  if (p->speed_boost == 0) {
                    wVar25 = L'\0';
                  }
                  else {
                    wVar25 = (p->speed_boost + 5) / 10;
                  }
                  bVar27 = pbVar15[lVar18].isaux != false;
                  wVar12 = L'\0';
                  if (bVar27) {
                    wVar12 = wVar25;
                  }
                  if (bVar27) {
                    wVar25 = L'\0';
                  }
                }
              }
joined_r0x001e342a:
              if (bVar7) {
                (*local_80.init_func)(wVar25,wVar12,&local_98);
                bVar7 = false;
              }
              else {
                (*local_80.accum_func)(wVar25,wVar12,&local_98);
              }
            }
          }
          else {
            iVar11 = strcmp(__s1,"object");
            if (iVar11 == 0) {
              uVar21 = (uint)uVar2;
              _Var9 = flag_has_dbg((*local_40)->untimed,6,(uint)uVar2,"(*cache)->untimed","ind");
              _Var10 = false;
              if ((entry->flags & L'\x01') != L'\0') {
                _Var10 = flag_has_dbg((*local_40)->timed,6,uVar21,"(*cache)->timed","ind");
              }
              _Var22 = _Var9;
              if (entry->p_abilities[lVar18].isaux != false) {
                _Var22 = _Var10;
                _Var10 = _Var9;
              }
              puVar8 = (ui_entry_combiner_funcs *)&local_80.accum_func;
              if (bVar7) {
                bVar7 = false;
                puVar8 = &local_80;
              }
              (*puVar8->init_func)(SUB14(_Var22,0),SUB14(_Var10,0),&local_98);
              _Var10 = flag_has_dbg(p->shape->flags,6,uVar21,"p->shape->flags","ind");
              if ((_Var10) &&
                 (_Var9 = flag_has_dbg(p->obj_k->flags,6,uVar21,"p->obj_k->flags","ind"), _Var9)) {
                bVar27 = entry->p_abilities[lVar18].isaux != false;
                uVar20 = 0;
                if (bVar27) {
                  uVar20 = (uint)_Var10;
                }
                uVar24 = (uint)_Var10;
                if (bVar27) {
                  uVar24 = 0;
                }
LAB_001e350d:
                (*local_80.accum_func)(uVar24,uVar20,&local_98);
              }
            }
            else {
              iVar11 = strcmp(__s1,"element");
              if ((iVar11 == 0) && ((local_48 & 1) == 0)) {
                iVar11 = 100;
                if ((wVar12 & 1U) != 0) {
                  lVar26 = 0;
                  piVar16 = local_38;
                  do {
                    if ((p->timed[lVar26] != 0) && (*piVar16 == uVar21)) {
                      iVar11 = 0x3c;
                      break;
                    }
                    lVar26 = lVar26 + 1;
                    piVar16 = piVar16 + 0x1e;
                  } while (lVar26 != 0x35);
                }
                iVar19 = (int)p->race->el_info[uVar2].res_level;
                iVar13 = iVar11;
                if (pbVar15[lVar18].isaux != false) {
                  iVar13 = iVar19;
                  iVar19 = iVar11;
                }
                puVar8 = (ui_entry_combiner_funcs *)&local_80.accum_func;
                if (bVar7) {
                  bVar7 = false;
                  puVar8 = &local_80;
                }
                (*puVar8->init_func)(iVar19,iVar13,&local_98);
                uVar21 = (uint)p->shape->el_info[uVar2].res_level;
                local_48 = CONCAT71((int7)((ulong)p->shape >> 8),1);
                if ((uVar21 != 100) && (p->obj_k->el_info[uVar2].res_level != 0)) {
                  uVar20 = uVar21;
                  uVar24 = 100;
                  if (entry->p_abilities[lVar18].isaux == false) {
                    uVar20 = 100;
                    uVar24 = uVar21;
                  }
                  goto LAB_001e350d;
                }
              }
            }
          }
        }
LAB_001e3622:
        lVar18 = lVar18 + 1;
      } while (lVar18 < entry->n_p_ability);
    }
    if (L'\0' < entry->n_obj_prop) {
      lVar18 = 0;
      lVar26 = 0;
      do {
        pbVar4 = entry->obj_props;
        iVar11 = *(int *)((long)&pbVar4->index + lVar18);
        if ((((&pbVar4->isaux)[lVar18] == true) && ((entry->flags & L'\x01') != L'\0')) ||
           (1 < *(int *)((long)&pbVar4->type + lVar18) - 1U)) goto LAB_001e3814;
        iVar19 = (int)p->shape->modifiers[iVar11];
        iVar13 = 0;
        if ((entry->flags & L'\x01') == L'\0') goto LAB_001e3771;
        _Var10 = flag_has_dbg((p->state).pflags,10,0x42,"p->state.pflags","(PF_ENHANCE_MAGIC)");
        switch(iVar11) {
        case 5:
          sVar3 = p->timed[0x33];
          iVar13 = (uint)_Var10 * 3 + 10;
          goto LAB_001e3763;
        default:
          goto switchD_001e36f2_caseD_6;
        case 7:
          sVar3 = p->timed[0x12];
          iVar13 = (uint)_Var10 * 3 + 5;
LAB_001e3763:
          if (sVar3 == 0) {
            iVar13 = 0;
          }
switchD_001e36f2_caseD_6:
          break;
        case 9:
          psVar5 = p->timed;
          if ((*psVar5 == 0) && (psVar5[0x1d] == 0)) {
            iVar13 = 0;
          }
          else {
            iVar13 = (uint)_Var10 * 3 + 10;
          }
          iVar17 = iVar13 + -5;
          if (psVar5[0x1b] == 0) {
            iVar17 = iVar13;
          }
          iVar6 = iVar17 + -10;
          if (psVar5[1] == 0) {
            iVar6 = iVar17;
          }
          iVar13 = iVar6 + 10;
          if (psVar5[0x1c] == 0) {
            iVar13 = iVar6;
          }
          break;
        case 10:
          if (p->timed[0x31] != 0) {
            iVar13 = (int)p->timed[0x31] / 0x14;
          }
        }
LAB_001e3771:
        iVar17 = iVar13;
        if ((&entry->obj_props->isaux)[lVar18] != false) {
          iVar17 = iVar19;
          iVar19 = iVar13;
        }
        puVar8 = (ui_entry_combiner_funcs *)&local_80.accum_func;
        if (bVar7) {
          bVar7 = false;
          puVar8 = &local_80;
        }
        (*puVar8->init_func)(iVar19,iVar17,&local_98);
        if (iVar11 == 7) {
          wVar12 = p->race->infra;
LAB_001e37e6:
          wVar25 = L'\0';
          if ((&entry->obj_props->isaux)[lVar18] != false) {
            wVar25 = wVar12;
            wVar12 = L'\0';
          }
          (*local_80.accum_func)(wVar12,wVar25,&local_98);
        }
        else if (iVar11 == 8) {
          wVar12 = p->race->r_skills[9] / 0x14;
          goto LAB_001e37e6;
        }
LAB_001e3814:
        lVar26 = lVar26 + 1;
        lVar18 = lVar18 + 0x10;
      } while (lVar26 < entry->n_obj_prop);
    }
    if (bVar7) {
      *local_58 = 0x7ffffffe;
      local_98.accum_aux = 0x7ffffffe;
      auxval = local_50;
    }
    else {
      (*local_80.finish_func)(&local_98);
      *local_58 = local_98.accum;
      auxval = local_50;
    }
  }
  *auxval = local_98.accum_aux;
  return;
}

Assistant:

void compute_ui_entry_values_for_player(const struct ui_entry *entry,
	struct player *p, struct cached_player_data **cache, int *val,
	int *auxval)
{
	struct ui_entry_combiner_state cst = { 0, 0, 0 };
	struct ui_entry_combiner_funcs combiner;
	bool first, element_done = false;
	int i;

	if (!p) {
		*val = UI_ENTRY_VALUE_NOT_PRESENT;
		*auxval = UI_ENTRY_VALUE_NOT_PRESENT;
		return;
	}
	if (*cache == NULL) {
		*cache = mem_alloc(sizeof(**cache));
		player_flags(p, (*cache)->untimed);
		of_wipe((*cache)->timed);
		player_flags_timed(p, (*cache)->timed);
		if (p->timed[TMD_TRAPSAFE]) {
			of_on((*cache)->timed, OF_TRAP_IMMUNE);
		}
	}
	first = true;
	if (ui_entry_combiner_get_funcs(entry->combiner_index, &combiner)) {
		assert(0);
	}
	for (i = 0; i < entry->n_p_ability; ++i) {
		int ind = entry->p_abilities[i].ability->index;

		if ((entry->flags & ENTRY_FLAG_TIMED_AUX) &&
			entry->p_abilities[i].isaux) {
			continue;
		}
		if (streq(entry->p_abilities[i].ability->type, "player")) {
			if (! player_has(p, ind)) {
				continue;
			}
			if (entry->p_abilities[i].have_value) {
				int v = entry->p_abilities[i].value;
				int a = UI_ENTRY_VALUE_NOT_PRESENT;

				if (entry->p_abilities[i].isaux) {
					int t = v;

					v = a;
					a = t;
				}
				if (first) {
					(*combiner.init_func)(v, a, &cst);
					first = false;
				} else {
					(*combiner.accum_func)(v, a, &cst);
				}
			} else {
				int v, a;
				struct object *launcher;

				/*
				 * Handle player abilities that did not bind a
				 * value to the user interface element as
				 * special cases.
				 */
				switch (ind) {
				case PF_BOW_SPEED_GREAT:
					launcher = equipped_item_by_slot_name(
						p, "shooting");
					if (launcher && kf_has(launcher->kind->kind_flags,
						KF_SHOOTS_ARROWS)) {
						v = p->lev / 3;
						a = 0;
					} else {
						v = 0;
						a = 0;
					}
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;

				case PF_BRAVERY_30:
					/*
					 * player_flags() accounts for
					 * PF_BRAVERY_30 so this is only
					 * necessary in cases where
					 * OF_PROT_FEAR isn't also bound to
					 * the element.
					 */
					v = (p->lev >= 30) ? 1 : 0;
					a = 0;
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;

				case PF_FURY:
				case PF_PHASEWALK:
					v = (p->speed_boost) ?
						 ((p->speed_boost + 5) / 10) : 0;
					a = 0;
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;

				case PF_HOLY:
					if ((p->lev > 35 &&
						player_has(p, PF_STRONG_MAGIC)) ||
						p->lev > 45) {
						v = 1;
					} else {
						v = 0;
					}
					a = 0;
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;

				case PF_SHADOW:
					if (player_of_has(p, OF_AGGRAVATE)) {
						v = -3;
						a = 0;
						if (entry->p_abilities[i].isaux) {
							int t = v;

							v = a;
							a = t;
						}
						if (first) {
							(*combiner.init_func)(v, a, &cst);
							first = false;
						} else {
							(*combiner.accum_func)(v, a, &cst);
						}
					};
					break;

				case PF_WOODEN:
					/* Account for unarmed digging bonus. */
					if (! slot_object(p, slot_by_name(p, "weapon"))) {
						v = p->lev / 2;
					} else {
						v = 0;
					}
					a = 0;
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;

				case PF_WOODSMAN:
					if (character_dungeon &&
						player_has(p, PF_ELVEN) &&
						square_istree(cave, p->grid)) {
						v = 3;
					} else {
						v = 0;
					}
					a = 0;
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;
				}
			}
		} else if (streq(entry->p_abilities[i].ability->type,
			"object")) {
			int v = of_has((*cache)->untimed, ind) ? 1 : 0;
			int a;

			if (entry->flags & ENTRY_FLAG_TIMED_AUX) {
				a = of_has((*cache)->timed, ind) ? 1 : 0;
			} else {
				a = 0;
			}
			if (entry->p_abilities[i].isaux) {
				int t = v;

				v = a;
				a = t;
			}
			if (first) {
				(*combiner.init_func)(v, a, &cst);
				first = false;
			} else {
				(*combiner.accum_func)(v, a, &cst);
			}

			v = of_has(p->shape->flags, ind) ? 1 : 0;
			a = 0;
			if (v && of_has(p->obj_k->flags, ind)) {
				if (entry->p_abilities[i].isaux) {
					int t = v;

					v = a;
					a = t;
				}
				(*combiner.accum_func)(v, a, &cst);
			}
		} else if (streq(entry->p_abilities[i].ability->type,
			"element") && !element_done) {
			int v = p->race->el_info[ind].res_level;
			int a;
			int base = RES_LEVEL_BASE;

			if (entry->flags & ENTRY_FLAG_TIMED_AUX) {
				a = get_timed_element_effect(p, ind);
			} else {
				a = base;
			}
			if (entry->p_abilities[i].isaux) {
				int t = v;

				v = a;
				a = t;
			}
			if (first) {
				(*combiner.init_func)(v, a, &cst);
				first = false;
			} else {
				(*combiner.accum_func)(v, a, &cst);
			}
			v = p->shape->el_info[ind].res_level;
			a = base;
			if (v != base && p->obj_k->el_info[ind].res_level) {
				if (entry->p_abilities[i].isaux) {
					int t = v;

					v = a;
					a = t;
				}
				(*combiner.accum_func)(v, a, &cst);
			}
			element_done = true;
		}
	}
	/*
	 * Since stats and modifiers aren't stored in the ability list, check
	 * if any object properties for those are bound to this element.
	 * Then lookup the player's intrinsic values for those.
	 */
	for (i = 0; i < entry->n_obj_prop; ++i) {
		int ind = entry->obj_props[i].index;
		int skill_ind, skill_cnv_num, skill_cnv_den;
		int v, a;

		if (entry->obj_props[i].isaux &&
			(entry->flags & ENTRY_FLAG_TIMED_AUX)) {
			continue;
		}
		switch (entry->obj_props[i].type) {
		case OBJ_PROPERTY_STAT:
		case OBJ_PROPERTY_MOD:
			v = p->shape->modifiers[ind];
			if (entry->flags & ENTRY_FLAG_TIMED_AUX) {
				a = get_timed_modifier_effect(p, ind);
			} else {
				a = 0;
			}
			if (entry->obj_props[i].isaux) {
				int t = v;

				v = a;
				a = t;
			}
			if (first) {
				(*combiner.init_func)(v, a, &cst);
				first = false;
			} else {
				(*combiner.accum_func)(v, a, &cst);
			}
			/*
			 * Racial information doesn't store modifiers but does
			 * store skills.  If applicable, extract the relevant
			 * value and convert.
			 */
			modifier_to_skill(ind, &skill_ind, &skill_cnv_num,
				&skill_cnv_den);
			if (skill_ind >= 0) {
				v = (p->race->r_skills[skill_ind] *
					skill_cnv_num) / skill_cnv_den;
				a = 0;
				if (entry->obj_props[i].isaux) {
					int t = v;

					v = a;
					a = t;
				}
				(*combiner.accum_func)(v, a, &cst);
			}
			/*
			 * Uggh, the player race handles infravision
			 * separately.
			 */
			if (ind == OBJ_MOD_INFRA) {
				v = p->race->infra;
				a = 0;
				if (entry->obj_props[i].isaux) {
					int t = v;

					v = a;
					a = t;
				}
				(*combiner.accum_func)(v, a, &cst);
			}
			break;
		}
	}
	if (first) {
		*val = UI_ENTRY_VALUE_NOT_PRESENT;
		*auxval = UI_ENTRY_VALUE_NOT_PRESENT;
	} else {
		(*combiner.finish_func)(&cst);
		*val = cst.accum;
		*auxval = cst.accum_aux;
	}
}